

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remap_struct.cpp
# Opt level: O0

void duckdb::RemapStruct(Vector *input,Vector *default_vector,Vector *result,idx_t result_size,
                        vector<duckdb::RemapColumnInfo,_true> *remap_info)

{
  ulong uVar1;
  VectorType VVar2;
  bool bVar3;
  VectorType VVar4;
  Vector *this;
  size_type sVar5;
  size_type sVar6;
  undefined8 uVar7;
  pointer this_00;
  Vector *in_RCX;
  Vector *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_> *in_R8;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *defaults_1;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *defaults;
  reference<Vector> child_default;
  Vector *input_vector;
  value_type *remap;
  idx_t i_1;
  idx_t input_idx;
  idx_t i;
  ValidityMask *result_validity;
  UnifiedVectorFormat format;
  bool has_top_level_null;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *result_vectors;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *input_vectors;
  idx_t in_stack_000001d8;
  Vector *in_stack_000001e0;
  Vector *in_stack_fffffffffffffe28;
  Vector *in_stack_fffffffffffffe30;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffe38;
  type in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe58;
  Vector *in_stack_fffffffffffffe60;
  Vector *in_stack_fffffffffffffe70;
  Vector *in_stack_fffffffffffffe78;
  Vector *in_stack_fffffffffffffe80;
  allocator local_129;
  string local_128 [24];
  UnifiedVectorFormat *in_stack_fffffffffffffef0;
  idx_t in_stack_fffffffffffffef8;
  Vector *in_stack_ffffffffffffff00;
  reference_wrapper<duckdb::Vector> local_f0;
  type local_e8;
  const_reference local_e0;
  ulong local_d8;
  idx_t local_d0;
  Vector *local_c8;
  TemplatedValidityMask<unsigned_long> *local_c0;
  SelectionVector *local_b8;
  TemplatedValidityMask<unsigned_long> local_a8;
  byte local_6e;
  undefined1 local_6d;
  allocator local_59;
  string local_58 [32];
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  *local_38;
  Vector *remap_info_00;
  
  VVar4 = (VectorType)((ulong)in_stack_fffffffffffffe58 >> 0x38);
  this = (Vector *)StructVector::GetEntries(in_stack_fffffffffffffe28);
  local_38 = &StructVector::GetEntries(in_stack_fffffffffffffe28)->
              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  ;
  sVar5 = ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::size(local_38);
  sVar6 = ::std::vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>::size
                    (in_R8);
  if (sVar5 != sVar6) {
    local_6d = 1;
    uVar7 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_58,"Remap info unaligned in remap struct",&local_59);
    InternalException::InternalException
              ((InternalException *)in_stack_fffffffffffffe30,(string *)in_stack_fffffffffffffe28);
    local_6d = 0;
    __cxa_throw(uVar7,&InternalException::typeinfo,InternalException::~InternalException);
  }
  local_6e = 0;
  VVar2 = Vector::GetVectorType(in_RDI);
  if (VVar2 == CONSTANT_VECTOR) {
    bVar3 = ConstantVector::IsNull((Vector *)0x13cf1c3);
    if (bVar3) {
      ConstantVector::SetNull
                (in_stack_fffffffffffffe80,SUB81((ulong)in_stack_fffffffffffffe78 >> 0x38,0));
      Vector::SetVectorType(in_stack_fffffffffffffe60,VVar4);
      return;
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffe40);
    Vector::ToUnifiedFormat
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    bVar3 = TemplatedValidityMask<unsigned_long>::AllValid(&local_a8);
    if (!bVar3) {
      local_c0 = &FlatVector::Validity((Vector *)0x13cf25f)->
                  super_TemplatedValidityMask<unsigned_long>;
      for (local_c8 = (Vector *)0x0; local_c8 < in_RCX; local_c8 = (Vector *)&local_c8->field_0x1) {
        local_d0 = SelectionVector::get_index(local_b8,(idx_t)local_c8);
        bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
        if (!bVar3) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffe30,
                     (idx_t)in_stack_fffffffffffffe28);
        }
      }
      bVar3 = TemplatedValidityMask<unsigned_long>::AllValid(local_c0);
      local_6e = (bVar3 ^ 0xffU) & 1;
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffe30);
  }
  local_d8 = 0;
  do {
    uVar1 = local_d8;
    sVar5 = ::std::vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>::size
                      (in_R8);
    if (sVar5 <= uVar1) {
      return;
    }
    local_e0 = vector<duckdb::RemapColumnInfo,_true>::operator[]
                         ((vector<duckdb::RemapColumnInfo,_true> *)in_stack_fffffffffffffe30,
                          (size_type)in_stack_fffffffffffffe28);
    bVar3 = optional_idx::IsValid(&local_e0->index);
    remap_info_00 = this;
    if ((!bVar3) ||
       (bVar3 = ::std::vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>::
                empty((vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_> *)
                      in_stack_fffffffffffffe40), remap_info_00 = this, bVar3)) {
      this = in_stack_fffffffffffffe80;
      bVar3 = optional_idx::IsValid(&local_e0->default_index);
      if (bVar3) {
        StructVector::GetEntries(in_stack_fffffffffffffe28);
        vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      *)in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
        unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                  ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                   in_stack_fffffffffffffe30);
        optional_idx::GetIndex((optional_idx *)in_stack_fffffffffffffe70);
        vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      *)in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
        unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                  ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                   in_stack_fffffffffffffe30);
        Vector::Reference(this,in_stack_fffffffffffffe78);
        vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      *)in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
        this_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                            ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>
                              *)in_stack_fffffffffffffe30);
        VVar4 = Vector::GetVectorType(this_00);
        if (VVar4 != CONSTANT_VECTOR) {
          uVar7 = __cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_128,"Default value in remap struct must be a constant",&local_129);
          InternalException::InternalException
                    ((InternalException *)in_stack_fffffffffffffe30,
                     (string *)in_stack_fffffffffffffe28);
          __cxa_throw(uVar7,&InternalException::typeinfo,InternalException::~InternalException);
        }
        if ((local_6e & 1) != 0) {
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
          ::operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                        *)in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
          unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                    ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                     in_stack_fffffffffffffe30);
          bVar3 = ConstantVector::IsNull((Vector *)0x13cf6ee);
          if (!bVar3) {
            vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
            ::operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                          *)in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
            unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                      ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                       in_stack_fffffffffffffe30);
            Vector::Flatten(in_stack_000001e0,in_stack_000001d8);
            vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
            ::operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                          *)in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
            in_stack_fffffffffffffe40 =
                 unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *
                            )in_stack_fffffffffffffe30);
            FlatVector::Validity((Vector *)0x13cf74e);
            FlatVector::SetValidity
                      (in_stack_fffffffffffffe30,(ValidityMask *)in_stack_fffffffffffffe28);
          }
        }
      }
      else {
        vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      *)in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
        unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                  ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                   in_stack_fffffffffffffe30);
        in_stack_fffffffffffffe30 = remap_info_00;
        remap_info_00 = in_stack_fffffffffffffe30;
        optional_idx::GetIndex((optional_idx *)in_stack_fffffffffffffe70);
        vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      *)in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
        unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                  ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                   in_stack_fffffffffffffe30);
        Vector::Reference(this,in_stack_fffffffffffffe78);
      }
    }
    else {
      optional_idx::GetIndex((optional_idx *)in_stack_fffffffffffffe70);
      vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>::
      operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  *)in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
      local_e8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *
                            )in_stack_fffffffffffffe30);
      ::std::reference_wrapper<duckdb::Vector>::
      reference_wrapper<duckdb::Vector&,void,duckdb::Vector*>
                ((reference_wrapper<duckdb::Vector> *)in_stack_fffffffffffffe30,
                 in_stack_fffffffffffffe28);
      bVar3 = optional_idx::IsValid(&local_e0->default_index);
      if (bVar3) {
        in_stack_fffffffffffffe78 = (Vector *)StructVector::GetEntries(in_stack_fffffffffffffe28);
        optional_idx::GetIndex((optional_idx *)in_stack_fffffffffffffe70);
        vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      *)in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
        unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                  ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                   in_stack_fffffffffffffe30);
        ::std::reference_wrapper<duckdb::Vector>::
        reference_wrapper<duckdb::Vector&,void,duckdb::Vector*>
                  ((reference_wrapper<duckdb::Vector> *)in_stack_fffffffffffffe30,
                   in_stack_fffffffffffffe28);
      }
      in_stack_fffffffffffffe70 = ::std::reference_wrapper<duckdb::Vector>::get(&local_f0);
      vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>::
      operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  *)in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
      unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                 in_stack_fffffffffffffe30);
      RemapStruct(in_RSI,in_RDX,in_RCX,(idx_t)in_R8,
                  (vector<duckdb::RemapColumnInfo,_true> *)remap_info_00);
    }
    local_d8 = local_d8 + 1;
    in_stack_fffffffffffffe80 = this;
    this = remap_info_00;
  } while( true );
}

Assistant:

static void RemapStruct(Vector &input, Vector &default_vector, Vector &result, idx_t result_size,
                        const vector<RemapColumnInfo> &remap_info) {
	auto &input_vectors = StructVector::GetEntries(input);
	auto &result_vectors = StructVector::GetEntries(result);
	if (result_vectors.size() != remap_info.size()) {
		throw InternalException("Remap info unaligned in remap struct");
	}
	bool has_top_level_null = false;
	// copy over the NULL values from the input vector
	if (input.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		if (ConstantVector::IsNull(input)) {
			ConstantVector::SetNull(result, true);
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			return;
		}
	} else {
		UnifiedVectorFormat format;
		input.ToUnifiedFormat(result_size, format);
		if (!format.validity.AllValid()) {
			auto &result_validity = FlatVector::Validity(result);
			for (idx_t i = 0; i < result_size; i++) {
				auto input_idx = format.sel->get_index(i);
				if (!format.validity.RowIsValid(input_idx)) {
					result_validity.SetInvalid(i);
				}
			}
			has_top_level_null = !result_validity.AllValid();
		}
	}
	// set up the correct vector references
	for (idx_t i = 0; i < remap_info.size(); i++) {
		auto &remap = remap_info[i];
		if (remap.index.IsValid() && !remap.child_remap_info.empty()) {
			// nested remap - recurse
			auto &input_vector = *input_vectors[remap.index.GetIndex()];
			reference<Vector> child_default = default_vector;
			if (remap.default_index.IsValid()) {
				auto &defaults = StructVector::GetEntries(default_vector);
				child_default = *defaults[remap.default_index.GetIndex()];
			}
			RemapStruct(input_vector, child_default.get(), *result_vectors[i], result_size, remap.child_remap_info);
			continue;
		}
		// root remap
		if (remap.default_index.IsValid()) {
			auto &defaults = StructVector::GetEntries(default_vector);
			result_vectors[i]->Reference(*defaults[remap.default_index.GetIndex()]);
			if (result_vectors[i]->GetVectorType() != VectorType::CONSTANT_VECTOR) {
				throw InternalException("Default value in remap struct must be a constant");
			}
			if (has_top_level_null && !ConstantVector::IsNull(*result_vectors[i])) {
				// if we have any top-level NULL values and the default value is not NULL, we need to propagate the NULL
				// values to the default value
				result_vectors[i]->Flatten(result_size);
				FlatVector::SetValidity(*result_vectors[i], FlatVector::Validity(result));
			}
		} else {
			result_vectors[i]->Reference(*input_vectors[remap.index.GetIndex()]);
		}
	}
}